

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O2

void __thiscall METADemuxer::~METADemuxer(METADemuxer *this)

{
  pointer ppFVar1;
  FileListIterator *pFVar2;
  FileListIterator **m_iterator;
  pointer ppFVar3;
  
  readClose(this);
  ppFVar1 = (this->m_iterators).
            super__Vector_base<FileListIterator_*,_std::allocator<FileListIterator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppFVar3 = (this->m_iterators).
                 super__Vector_base<FileListIterator_*,_std::allocator<FileListIterator_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppFVar3 != ppFVar1; ppFVar3 = ppFVar3 + 1) {
    pFVar2 = *ppFVar3;
    if (pFVar2 != (FileListIterator *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&pFVar2->m_files);
    }
    operator_delete(pFVar2,0x28);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->m_processedTracks)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>_>_>
  ::~_Rb_tree(&(this->m_mplsStreamMap)._M_t);
  std::vector<StreamInfo,_std::allocator<StreamInfo>_>::~vector(&this->m_codecInfo);
  std::__cxx11::string::~string((string *)&this->m_streamName);
  ContainerToReaderWrapper::~ContainerToReaderWrapper(&this->m_containerReader);
  std::_Vector_base<FileListIterator_*,_std::allocator<FileListIterator_*>_>::~_Vector_base
            (&(this->m_iterators).
              super__Vector_base<FileListIterator_*,_std::allocator<FileListIterator_*>_>);
  AbstractDemuxer::~AbstractDemuxer(&this->super_AbstractDemuxer);
  return;
}

Assistant:

METADemuxer::~METADemuxer()
{
    readClose();
    for (FileListIterator*& m_iterator : m_iterators) delete m_iterator;
}